

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::BrokerServer(BrokerServer *this,int argc,char **argv)

{
  undefined1 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char ***in_stack_00000020;
  int *in_stack_00000028;
  helicsCLI11App *in_stack_00000030;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  BrokerServer *in_stack_000005d8;
  size_type in_stack_00001328;
  undefined8 in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff60,
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
            *)0x1e6160);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  gmlc::utilities::randomString_abi_cxx11_(in_stack_00001328);
  std::operator+(in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(in_stack_ffffffffffffff60);
  std::unique_ptr<helics::fileops::JsonStorage,std::default_delete<helics::fileops::JsonStorage>>::
  unique_ptr<std::default_delete<helics::fileops::JsonStorage>,void>
            ((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
              *)in_stack_ffffffffffffff60);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xa8);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  generateArgProcessing(in_stack_000005d8);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x1e6262);
  helicsCLI11App::helics_parse<int&,char**&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_00);
  return;
}

Assistant:

BrokerServer::BrokerServer(int argc, char* argv[]):
    server_name_{gmlc::utilities::randomString(5) + "_broker_server"}
{
    auto app = generateArgProcessing();
    app->helics_parse(argc, argv);
}